

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_scalar_split(secp256k1_scalar *full)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint uVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  secp256k1_scalar *r;
  secp256k1_scalar *psVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  secp256k1_scalar s1;
  secp256k1_scalar slam;
  uchar zero [32];
  secp256k1_scalar s;
  uchar tmp [32];
  secp256k1_scalar local_f8;
  secp256k1_scalar local_d8;
  char local_b8 [32];
  secp256k1_scalar local_98;
  uint64_t local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  undefined1 local_48 [16];
  
  psVar28 = &local_f8;
  local_b8[0x10] = '\0';
  local_b8[0x11] = '\0';
  local_b8[0x12] = '\0';
  local_b8[0x13] = '\0';
  local_b8[0x14] = '\0';
  local_b8[0x15] = '\0';
  local_b8[0x16] = '\0';
  local_b8[0x17] = '\0';
  local_b8[0x18] = '\0';
  local_b8[0x19] = '\0';
  local_b8[0x1a] = '\0';
  local_b8[0x1b] = '\0';
  local_b8[0x1c] = '\0';
  local_b8[0x1d] = '\0';
  local_b8[0x1e] = '\0';
  local_b8[0x1f] = '\0';
  local_b8[0] = '\0';
  local_b8[1] = '\0';
  local_b8[2] = '\0';
  local_b8[3] = '\0';
  local_b8[4] = '\0';
  local_b8[5] = '\0';
  local_b8[6] = '\0';
  local_b8[7] = '\0';
  local_b8[8] = '\0';
  local_b8[9] = '\0';
  local_b8[10] = '\0';
  local_b8[0xb] = '\0';
  local_b8[0xc] = '\0';
  local_b8[0xd] = '\0';
  local_b8[0xe] = '\0';
  local_b8[0xf] = '\0';
  secp256k1_scalar_split_lambda(&local_f8,&local_d8,full);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_d8.d[0];
  uVar22 = SUB168(ZEXT816(0xdf02967c1b23bd72) * auVar1,8);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar22;
  local_78 = SUB168(ZEXT816(0xdf02967c1b23bd72) * auVar1,0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_d8.d[1];
  auVar2 = ZEXT816(0xdf02967c1b23bd72) * auVar2;
  uVar29 = SUB168(auVar2 + auVar17,0);
  uVar34 = SUB168(auVar2 + auVar17,8);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_d8.d[0];
  uVar23 = SUB168(ZEXT816(0x122e22ea20816678) * auVar3,8);
  uVar19 = SUB168(ZEXT816(0x122e22ea20816678) * auVar3,0);
  local_70 = uVar29 + uVar19;
  uVar19 = (ulong)CARRY8(uVar29,uVar19);
  uVar29 = uVar34 + uVar23;
  uVar35 = uVar29 + uVar19;
  uVar36 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar22,auVar2._0_8_)) +
           (ulong)(CARRY8(uVar34,uVar23) || CARRY8(uVar29,uVar19));
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_d8.d[2];
  uVar24 = SUB168(ZEXT816(0xdf02967c1b23bd72) * auVar4,8);
  uVar19 = SUB168(ZEXT816(0xdf02967c1b23bd72) * auVar4,0);
  uVar22 = uVar35 + uVar19;
  uVar19 = (ulong)CARRY8(uVar35,uVar19);
  uVar23 = uVar36 + uVar24;
  uVar37 = uVar23 + uVar19;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_d8.d[1];
  uVar25 = SUB168(ZEXT816(0x122e22ea20816678) * auVar5,8);
  uVar29 = SUB168(ZEXT816(0x122e22ea20816678) * auVar5,0);
  uVar35 = uVar22 + uVar29;
  uVar29 = (ulong)CARRY8(uVar22,uVar29);
  uVar34 = uVar37 + uVar25;
  uVar38 = uVar34 + uVar29;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_d8.d[0];
  uVar26 = SUB168(ZEXT816(0xa5261c028812645a) * auVar6,8);
  uVar22 = SUB168(ZEXT816(0xa5261c028812645a) * auVar6,0);
  local_68 = uVar35 + uVar22;
  uVar22 = (ulong)CARRY8(uVar35,uVar22);
  uVar35 = uVar38 + uVar26;
  uVar39 = uVar35 + uVar22;
  uVar30 = (ulong)(CARRY8(uVar36,uVar24) || CARRY8(uVar23,uVar19)) +
           (ulong)(CARRY8(uVar37,uVar25) || CARRY8(uVar34,uVar29)) +
           (ulong)(CARRY8(uVar38,uVar26) || CARRY8(uVar35,uVar22));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_d8.d[3];
  uVar26 = SUB168(ZEXT816(0xdf02967c1b23bd72) * auVar7,8);
  uVar19 = SUB168(ZEXT816(0xdf02967c1b23bd72) * auVar7,0);
  uVar22 = uVar39 + uVar19;
  uVar19 = (ulong)CARRY8(uVar39,uVar19);
  uVar34 = uVar30 + uVar26;
  uVar39 = uVar34 + uVar19;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_d8.d[2];
  uVar36 = SUB168(ZEXT816(0x122e22ea20816678) * auVar8,8);
  uVar29 = SUB168(ZEXT816(0x122e22ea20816678) * auVar8,0);
  uVar23 = uVar22 + uVar29;
  uVar29 = (ulong)CARRY8(uVar22,uVar29);
  uVar35 = uVar39 + uVar36;
  uVar31 = uVar35 + uVar29;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_d8.d[1];
  uVar37 = SUB168(ZEXT816(0xa5261c028812645a) * auVar9,8);
  uVar22 = SUB168(ZEXT816(0xa5261c028812645a) * auVar9,0);
  uVar25 = uVar23 + uVar22;
  uVar22 = (ulong)CARRY8(uVar23,uVar22);
  uVar24 = uVar31 + uVar37;
  uVar32 = uVar24 + uVar22;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_d8.d[0];
  uVar38 = SUB168(ZEXT816(0x5363ad4cc05c30e0) * auVar10,8);
  uVar23 = SUB168(ZEXT816(0x5363ad4cc05c30e0) * auVar10,0);
  local_60 = uVar25 + uVar23;
  uVar23 = (ulong)CARRY8(uVar25,uVar23);
  uVar25 = uVar32 + uVar38;
  uVar33 = uVar25 + uVar23;
  uVar36 = (ulong)(CARRY8(uVar30,uVar26) || CARRY8(uVar34,uVar19)) +
           (ulong)(CARRY8(uVar39,uVar36) || CARRY8(uVar35,uVar29)) +
           (ulong)(CARRY8(uVar31,uVar37) || CARRY8(uVar24,uVar22)) +
           (ulong)(CARRY8(uVar32,uVar38) || CARRY8(uVar25,uVar23));
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_d8.d[3];
  uVar24 = SUB168(ZEXT816(0x122e22ea20816678) * auVar11,8);
  uVar19 = SUB168(ZEXT816(0x122e22ea20816678) * auVar11,0);
  uVar22 = uVar33 + uVar19;
  uVar19 = (ulong)CARRY8(uVar33,uVar19);
  uVar23 = uVar36 + uVar24;
  uVar37 = uVar23 + uVar19;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_d8.d[2];
  uVar25 = SUB168(ZEXT816(0xa5261c028812645a) * auVar12,8);
  uVar29 = SUB168(ZEXT816(0xa5261c028812645a) * auVar12,0);
  uVar35 = uVar22 + uVar29;
  uVar29 = (ulong)CARRY8(uVar22,uVar29);
  uVar34 = uVar37 + uVar25;
  uVar38 = uVar34 + uVar29;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_d8.d[1];
  uVar26 = SUB168(ZEXT816(0x5363ad4cc05c30e0) * auVar13,8);
  uVar22 = SUB168(ZEXT816(0x5363ad4cc05c30e0) * auVar13,0);
  local_58 = uVar35 + uVar22;
  uVar22 = (ulong)CARRY8(uVar35,uVar22);
  uVar35 = uVar38 + uVar26;
  uVar30 = uVar35 + uVar22;
  uVar24 = (ulong)(CARRY8(uVar36,uVar24) || CARRY8(uVar23,uVar19)) +
           (ulong)(CARRY8(uVar37,uVar25) || CARRY8(uVar34,uVar29)) +
           (ulong)(CARRY8(uVar38,uVar26) || CARRY8(uVar35,uVar22));
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_d8.d[3];
  uVar34 = SUB168(ZEXT816(0xa5261c028812645a) * auVar14,8);
  uVar19 = SUB168(ZEXT816(0xa5261c028812645a) * auVar14,0);
  uVar23 = uVar30 + uVar19;
  uVar19 = (ulong)CARRY8(uVar30,uVar19);
  uVar22 = uVar24 + uVar34;
  uVar25 = uVar22 + uVar19;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_d8.d[2];
  uVar35 = SUB168(ZEXT816(0x5363ad4cc05c30e0) * auVar15,8);
  uVar29 = SUB168(ZEXT816(0x5363ad4cc05c30e0) * auVar15,0);
  local_50 = uVar23 + uVar29;
  uVar29 = (ulong)CARRY8(uVar23,uVar29);
  uVar23 = uVar25 + uVar35;
  local_48._8_8_ =
       (ulong)(CARRY8(uVar24,uVar34) || CARRY8(uVar22,uVar19)) +
       (ulong)(CARRY8(uVar25,uVar35) || CARRY8(uVar23,uVar29));
  local_48._0_8_ = uVar23 + uVar29;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_d8.d[3];
  local_48 = ZEXT816(0x5363ad4cc05c30e0) * auVar16 + local_48;
  r = &local_98;
  secp256k1_scalar_reduce_512(r,&local_78);
  secp256k1_scalar_add(r,r,&local_f8);
  if ((((local_98.d[0] == full->d[0]) && (local_98.d[1] == full->d[1])) &&
      (local_98.d[2] == full->d[2])) && (local_98.d[3] == full->d[3])) {
    uVar18 = -(int)((long)local_f8.d[3] >> 0x3f);
    uVar21 = uVar18 ^ 1;
    uVar27 = uVar21;
    if (local_f8.d[2] == 0xffffffffffffffff) {
      uVar27 = 0;
    }
    if (0x5d576e7357a4501c < local_f8.d[1]) {
      uVar21 = 0;
    }
    uVar21 = (uVar21 | uVar27 | local_f8.d[3] < 0x7fffffffffffffff) ^ 1;
    uVar27 = 0;
    if (0xdfe92f46681b20a0 < local_f8.d[0]) {
      uVar27 = uVar21;
    }
    if (0x5d576e7357a4501d < local_f8.d[1]) {
      uVar27 = uVar21;
    }
    if (uVar27 != 0 || uVar18 != 0) {
      secp256k1_scalar_negate(&local_f8,&local_f8);
    }
    uVar18 = -(int)((long)local_d8.d[3] >> 0x3f);
    uVar21 = uVar18 ^ 1;
    uVar27 = uVar21;
    if (local_d8.d[2] == 0xffffffffffffffff) {
      uVar27 = 0;
    }
    if (0x5d576e7357a4501c < local_d8.d[1]) {
      uVar21 = 0;
    }
    uVar21 = (uVar21 | uVar27 | local_d8.d[3] < 0x7fffffffffffffff) ^ 1;
    uVar27 = 0;
    if (0xdfe92f46681b20a0 < local_d8.d[0]) {
      uVar27 = uVar21;
    }
    if (0x5d576e7357a4501d < local_d8.d[1]) {
      uVar27 = uVar21;
    }
    if (uVar27 != 0 || uVar18 != 0) {
      secp256k1_scalar_negate(&local_d8,&local_d8);
    }
    secp256k1_scalar_get_b32((uchar *)&local_78,&local_f8);
    lVar20 = 0;
    do {
      r = psVar28;
      if (local_b8[lVar20] != *(char *)((long)&local_78 + lVar20)) goto LAB_0015ba9f;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x10);
    r = &local_d8;
    secp256k1_scalar_get_b32((uchar *)&local_78,r);
    lVar20 = 0;
    while (local_b8[lVar20] == *(char *)((long)&local_78 + lVar20)) {
      lVar20 = lVar20 + 1;
      if (lVar20 == 0x10) {
        return;
      }
    }
  }
  else {
    test_scalar_split_cold_3();
LAB_0015ba9f:
    test_scalar_split_cold_1();
  }
  test_scalar_split_cold_2();
  *(int *)r->d = (int)r->d[0] + -1;
  return;
}

Assistant:

static void test_scalar_split(const secp256k1_scalar* full) {
    secp256k1_scalar s, s1, slam;
    const unsigned char zero[32] = {0};
    unsigned char tmp[32];

    secp256k1_scalar_split_lambda(&s1, &slam, full);

    /* check slam*lambda + s1 == full */
    secp256k1_scalar_mul(&s, &secp256k1_const_lambda, &slam);
    secp256k1_scalar_add(&s, &s, &s1);
    CHECK(secp256k1_scalar_eq(&s, full));

    /* check that both are <= 128 bits in size */
    if (secp256k1_scalar_is_high(&s1)) {
        secp256k1_scalar_negate(&s1, &s1);
    }
    if (secp256k1_scalar_is_high(&slam)) {
        secp256k1_scalar_negate(&slam, &slam);
    }

    secp256k1_scalar_get_b32(tmp, &s1);
    CHECK(secp256k1_memcmp_var(zero, tmp, 16) == 0);
    secp256k1_scalar_get_b32(tmp, &slam);
    CHECK(secp256k1_memcmp_var(zero, tmp, 16) == 0);
}